

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::AddTapScriptSign
          (TransactionContext *this,OutPoint *outpoint,TaprootScriptTree *tree,
          SchnorrPubkey *internal_pubkey,
          vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *sign_data_list,
          ByteData *annex)

{
  SchnorrPubkey *in_RCX;
  TapBranch *in_RDX;
  Script *in_RDI;
  long in_R9;
  Script script;
  ByteData control;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> sign_params;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  Script *in_stack_ffffffffffffff58;
  TransactionContext *in_stack_ffffffffffffff60;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffff98;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *in_stack_ffffffffffffffa0;
  
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&stack0xffffffffffffffa0,in_RCX,in_RDX,(SchnorrPubkey *)0x0,(Script *)0x0);
  core::TapBranch::GetScript((Script *)&stack0xffffffffffffff58,in_RDX);
  std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
  emplace_back<cfd::core::Script&>
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
  emplace_back<cfd::core::ByteData&>
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_ffffffffffffff60,(ByteData *)in_stack_ffffffffffffff58);
  if (in_R9 != 0) {
    std::vector<cfd::SignParameter,std::allocator<cfd::SignParameter>>::
    emplace_back<cfd::core::ByteData_const&>
              ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
               in_stack_ffffffffffffff60,(ByteData *)in_stack_ffffffffffffff58);
  }
  AddSign(in_stack_ffffffffffffff60,(OutPoint *)in_stack_ffffffffffffff58,
          (vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)in_RDI,
          (bool)in_stack_ffffffffffffff4f,(bool)in_stack_ffffffffffffff4e);
  core::Script::~Script(in_RDI);
  core::ByteData::~ByteData((ByteData *)0x5110c1);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector
            ((vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> *)
             in_stack_ffffffffffffff60);
  return;
}

Assistant:

void TransactionContext::AddTapScriptSign(
    const OutPoint& outpoint, const TaprootScriptTree& tree,
    const SchnorrPubkey& internal_pubkey,
    const std::vector<SignParameter>& sign_data_list, const ByteData* annex) {
  std::vector<SignParameter> sign_params = sign_data_list;
  auto control = TaprootUtil::CreateTapScriptControl(internal_pubkey, tree);
  auto script = tree.GetScript();
  sign_params.emplace_back(script);
  sign_params.emplace_back(control);
  if (annex != nullptr) sign_params.emplace_back(*annex);
  AddSign(outpoint, sign_params, true, true);
}